

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

void absl::StrAppend(string *dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  pointer __dest;
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pcVar5;
  size_t sVar6;
  size_t __n;
  ulong uVar7;
  pointer pcVar8;
  
  sVar1 = (a->piece_).length_;
  if ((sVar1 != 0) &&
     ((ulong)((long)(a->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length)) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe0,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = (b->piece_).length_;
  if ((sVar2 != 0) &&
     ((ulong)((long)(b->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length)) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe1,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar3 = (c->piece_).length_;
  if ((sVar3 != 0) &&
     ((ulong)((long)(c->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length)) {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe2,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar4 = (d->piece_).length_;
  if (sVar4 == 0) {
    uVar7 = dest->_M_string_length;
  }
  else {
    uVar7 = dest->_M_string_length;
    if ((ulong)((long)(d->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= uVar7) {
      __assert_fail("((d).size() == 0) || (uintptr_t((d).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                    ,0xe3,
                    "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                   );
    }
  }
  std::__cxx11::string::resize
            ((ulong)dest,(char)sVar3 + (char)sVar4 + (char)sVar2 + (char)sVar1 + (char)uVar7);
  pcVar5 = (dest->_M_dataplus)._M_p;
  pcVar8 = pcVar5 + uVar7;
  sVar6 = (a->piece_).length_;
  __dest = pcVar8 + sVar6;
  memcpy(pcVar8,(a->piece_).ptr_,sVar6);
  sVar6 = (b->piece_).length_;
  pcVar8 = __dest + sVar6;
  memcpy(__dest,(b->piece_).ptr_,sVar6);
  sVar6 = (c->piece_).length_;
  memcpy(pcVar8,(c->piece_).ptr_,sVar6);
  __n = (d->piece_).length_;
  memcpy(pcVar8 + sVar6,(d->piece_).ptr_,__n);
  if (pcVar8 + sVar6 + __n == pcVar5 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0xed,
                "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(string* dest, const AlphaNum& a, const AlphaNum& b,
               const AlphaNum& c, const AlphaNum& d) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  ASSERT_NO_OVERLAP(*dest, d);
  string::size_type old_size = dest->size();
  strings_internal::STLStringResizeUninitialized(
      dest, old_size + a.size() + b.size() + c.size() + d.size());
  char* const begin = &*dest->begin();
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + dest->size());
}